

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load_ext_resfiles(CVmImageLoader *this)

{
  long lVar1;
  void *pvVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *filename;
  CVmFile *this_00;
  CVmImageLoader *pCVar5;
  int iVar6;
  long *in_FS_OFFSET;
  char suffix_lc [4];
  char suffix_uc [4];
  CVmImageLoader *loader;
  CVmImageFile *imagefp;
  CVmImageLoaderMres_std res_ifc;
  err_frame_t err_cur__;
  char resfile [4096];
  char local_1148 [8];
  CVmImageLoader *local_1140;
  CVmImageFile *local_1138;
  CVmImageLoaderMres local_1130;
  CVmHostIfc *local_1128;
  int local_1120;
  uint local_1118 [2];
  long local_1110;
  void *local_1108;
  __jmp_buf_tag local_1100;
  char local_1038 [4104];
  
  builtin_strncpy(local_1148,"3r0",4);
  builtin_strncpy(local_1148 + 4,"3R0",4);
  iVar6 = -10;
  do {
    cVar3 = (char)iVar6 + ':';
    local_1148[6] = cVar3;
    local_1148[2] = cVar3;
    iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
    if (CONCAT44(extraout_var,iVar4) == 0) {
      strcpy(local_1038,this->fname_);
    }
    else {
      iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xf])();
      filename = os_get_root_name(this->fname_);
      os_build_full_path(local_1038,0x1000,(char *)CONCAT44(extraout_var_00,iVar4),filename);
    }
    os_remext(local_1038);
    os_addext(local_1038,local_1148);
    iVar4 = access(local_1038,0);
    if (iVar4 != 0) {
      os_remext(local_1038);
      os_addext(local_1038,local_1148 + 4);
    }
    iVar4 = access(local_1038,0);
    if (iVar4 == 0) {
      local_1138 = (CVmImageFile *)0x0;
      local_1140 = (CVmImageLoader *)0x0;
      iVar4 = (*G_host_ifc_X->_vptr_CVmHostIfc[10])(G_host_ifc_X,local_1038);
      this_00 = (CVmFile *)operator_new(0x10);
      this_00->fp_ = (osfildef *)0x0;
      this_00->seek_base_ = 0;
      G_err_frame::__tls_init();
      local_1110 = *in_FS_OFFSET;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = (long)local_1118;
      local_1118[0] = _setjmp(&local_1100);
      if (local_1118[0] == 0) {
        local_1130._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_003665f0;
        local_1128 = G_host_ifc_X;
        local_1120 = iVar4;
        CVmFile::open_read(this_00,local_1038,0xc);
        local_1138 = (CVmImageFile *)operator_new(0x20);
        local_1138->_vptr_CVmImageFile = (_func_int **)&PTR__CVmImageFileExt_003663f8;
        local_1138[1]._vptr_CVmImageFile = (_func_int **)this_00;
        local_1138[2]._vptr_CVmImageFile = (_func_int **)0x0;
        local_1138[3]._vptr_CVmImageFile = (_func_int **)0x0;
        pCVar5 = (CVmImageLoader *)operator_new(0x98);
        CVmImageLoader(pCVar5,local_1138,local_1038,0);
        local_1140 = pCVar5;
        load_resource_file(pCVar5,&local_1130);
      }
      pCVar5 = local_1140;
      if (-1 < (short)local_1118[0]) {
        local_1118[0] = local_1118[0] | 0x8000;
        if (local_1140 != (CVmImageLoader *)0x0) {
          if (local_1140 != (CVmImageLoader *)0x0) {
            ~CVmImageLoader(local_1140);
          }
          operator_delete(pCVar5,0x98);
        }
        if ((local_1138 != (CVmImageFile *)0x0) && (local_1138 != (CVmImageFile *)0x0)) {
          (*local_1138->_vptr_CVmImageFile[1])();
        }
        CVmFile::~CVmFile(this_00);
        operator_delete(this_00,0x10);
      }
      lVar1 = local_1110;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = lVar1;
      if ((local_1118[0] & 0x4001) != 0) {
        G_err_frame::__tls_init();
        if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
          G_err_frame::__tls_init();
          free(*(void **)(*in_FS_OFFSET + 0x10));
        }
        pvVar2 = local_1108;
        G_err_frame::__tls_init();
        *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
        err_rethrow();
      }
      if ((local_1118[0] & 2) != 0) {
        free(local_1108);
      }
    }
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void CVmImageLoader::load_ext_resfiles(VMG0_)
{
    int i;
    char suffix_lc[4];
    char suffix_uc[4];

    /* set up the templates for the resource file suffix */
    strcpy(suffix_lc, "3r0");
    strcpy(suffix_uc, "3R0");
    
    /* 
     *   Search for resource files with the same name as the image file, but
     *   with the extension replaced with .3r0 through .3r9.  Try both
     *   lower-case and upper-case names (in that order), in case the file
     *   system is case-sensitive.  
     */
    for (i = 0 ; i < 10 ; ++i)
    {
        char resfile[OSFNMAX];
        
        /* substitute the current suffix number */
        suffix_lc[2] = suffix_uc[2] = i + '0';

        /* 
         *   if there's an explicit resource path, use it, otherwise use
         *   the same directory that contains the image file 
         */
        if (G_host_ifc->get_res_path() != 0)
        {
            /* 
             *   there's an explicit resource path - build the full path to
             *   the resource file using the resource path and the root name
             *   of the image file 
             */
            os_build_full_path(resfile, sizeof(resfile),
                               G_host_ifc->get_res_path(),
                               os_get_root_name(fname_));
        }
        else
        {
            /* 
             *   there's no resoruce path - use the image file full name,
             *   including any directory path information 
             */
            strcpy(resfile, fname_);
        }

        /* replace the old image file extension with the resource suffix */
        os_remext(resfile);
        os_addext(resfile, suffix_lc);

        /* if this file doesn't exist, try the upper-case name */
        if (osfacc(resfile))
        {
            /* replace the suffix with the upper-case version */
            os_remext(resfile);
            os_addext(resfile, suffix_uc);
        }

        /* check to see if this file exists */
        if (!osfacc(resfile))
        {
            int fileno;
            CVmFile *fp;
            CVmImageFile *volatile imagefp = 0;
            CVmImageLoader *volatile loader = 0;
            
            /* ask the host system to assign a file number */
            fileno = G_host_ifc->add_resfile(resfile);

            /* create a file object for reading the file */
            fp = new CVmFile();

            err_try
            {
                CVmImageLoaderMres_std res_ifc(fileno, G_host_ifc);

                /* open the file */
                fp->open_read(resfile, OSFTT3IMG);

                /* set up the loader */
                imagefp = new CVmImageFileExt(fp);
                loader = new CVmImageLoader(imagefp, resfile, 0);

                /* load the resource-only file */
                loader->load_resource_file(&res_ifc);
            }
            err_finally
            {
                /* delete the objects we created */
                if (loader != 0)
                    delete loader;
                if (imagefp != 0)
                    delete imagefp;
                delete fp;
            }
            err_end;
        }